

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

Gazetteer * __thiscall CoreML::Specification::Model::mutable_gazetteer(Model *this)

{
  Gazetteer *this_00;
  
  if (this->_oneof_case_[0] == 0x7d4) {
    this_00 = (Gazetteer *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x7d4;
    this_00 = (Gazetteer *)operator_new(0x38);
    CoreMLModels::Gazetteer::Gazetteer(this_00);
    (this->Type_).gazetteer_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::CoreMLModels::Gazetteer* Model::mutable_gazetteer() {
  if (!has_gazetteer()) {
    clear_Type();
    set_has_gazetteer();
    Type_.gazetteer_ = new ::CoreML::Specification::CoreMLModels::Gazetteer;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.gazetteer)
  return Type_.gazetteer_;
}